

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_leadingNumbers.cpp
# Opt level: O2

void __thiscall
leadingNumbers_invalid_Test::~leadingNumbers_invalid_Test(leadingNumbers_invalid_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(leadingNumbers, invalid)
{
    size_t index = 0;
    auto res = testLeadingNumber("(45*7*m)", index);
    EXPECT_TRUE((std::isnan)(res));
    EXPECT_EQ(index, 0U);

    res = testLeadingNumber("meter", index);
    EXPECT_TRUE((std::isnan)(res));
    EXPECT_EQ(index, 0U);

    res = testLeadingNumber("92*(452.252.34)", index);
    EXPECT_FALSE((std::isnan)(res));
    EXPECT_EQ(res, 92);
    EXPECT_EQ(index, 2U);

    res = testLeadingNumber("2.3^(12m)", index);
    EXPECT_TRUE((std::isnan)(res));
    EXPECT_EQ(index, 0U);
}